

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt32x4_4
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  OpCode opcode_00;
  RegOpnd *pRVar4;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *this_00;
  undefined4 *puVar5;
  Instr *pIVar6;
  Opnd *pOVar7;
  Instr *instr;
  OpCode opcode;
  RegOpnd *dstOpnd;
  RegOpnd *mask;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  ValueType valueType;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  VVar3 = GetSimdValueTypeFromIRType(this,TySimd128I4);
  pRVar4 = BuildSrcOpnd(this,src1RegSlot,TySimd128I4);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,VVar3);
  src1 = BuildSrcOpnd(this,src2RegSlot,TySimd128I4);
  IR::Opnd::SetValueType(&src1->super_Opnd,VVar3);
  src1_00 = BuildSrcOpnd(this,src3RegSlot,TySimd128I4);
  IR::Opnd::SetValueType(&src1->super_Opnd,VVar3);
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128I4);
  VVar3 = GetSimdValueTypeFromIRType(this,TySimd128I4);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar3);
  opcode_00 = GetSimdOpcode(this,newOpcode);
  if (opcode_00 == EndOfBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xff9,"((uint32)opcode)","Invalid backend SIMD opcode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar6 = AddExtendedArg(this,pRVar4,(RegOpnd *)0x0,offset);
  pOVar7 = IR::Instr::GetDst(pIVar6);
  pRVar4 = IR::Opnd::AsRegOpnd(pOVar7);
  pIVar6 = AddExtendedArg(this,src1,pRVar4,offset);
  pOVar7 = IR::Instr::GetDst(pIVar6);
  pRVar4 = IR::Opnd::AsRegOpnd(pOVar7);
  pIVar6 = AddExtendedArg(this,src1_00,pRVar4,offset);
  pOVar7 = IR::Instr::GetDst(pIVar6);
  pIVar6 = IR::Instr::New(opcode_00,&this_00->super_Opnd,pOVar7,this->m_func);
  AddInstr(this,pIVar6,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt32x4_4(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG4)
{
    ValueType valueType = GetSimdValueTypeFromIRType(TySimd128I4);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128I4);
    src1Opnd->SetValueType(valueType);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TySimd128I4);
    src2Opnd->SetValueType(valueType);

    IR::RegOpnd * mask = BuildSrcOpnd(src3RegSlot, TySimd128I4);
    src2Opnd->SetValueType(valueType);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I4);
    dstOpnd->SetValueType(GetSimdValueTypeFromIRType(TySimd128I4));

    Js::OpCode opcode;

    opcode = GetSimdOpcode(newOpcode);

    AssertMsg((uint32)opcode, "Invalid backend SIMD opcode");

    IR::Instr* instr = nullptr;

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(mask, instr->GetDst()->AsRegOpnd(), offset);

    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}